

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall
ExecutionEngine::startExecutionEngine(ExecutionEngine *this,ClassRuntime *classRuntime)

{
  bool bVar1;
  uint32_t uVar2;
  VMStack *this_00;
  anon_union_8_10_52016fac_for_data this_01;
  Frame *pFVar3;
  byte *pbVar4;
  code *pcVar5;
  ExecutionEngine *this_02;
  vector<Value,_std::allocator<Value>_> arguments;
  Value commandLineArgs;
  vector<Value,_std::allocator<Value>_> local_148;
  string local_130;
  string local_110;
  Value local_f0;
  vector<Value,_std::allocator<Value>_> local_e0;
  vector<Value,_std::allocator<Value>_> local_c8;
  string local_b0;
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  this_00 = VMStack::getInstance();
  local_148.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_148.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Value *)0x0;
  local_148.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Value *)0x0;
  local_f0.type = REFERENCE;
  this_01.object = (Object *)operator_new(0x28);
  ArrayObject::ArrayObject((ArrayObject *)this_01.object,REFERENCE);
  local_f0.data.object = this_01.object;
  if (local_148.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_148.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<Value,std::allocator<Value>>::_M_realloc_insert<Value_const&>
              ((vector<Value,std::allocator<Value>> *)&local_148,
               (iterator)
               local_148.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_f0);
  }
  else {
    (local_148.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
    _M_finish)->printType = local_f0.printType;
    (local_148.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
    _M_finish)->type = local_f0.type;
    ((local_148.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
     _M_finish)->data).object = (Object *)this_01;
    local_148.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_148.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  pFVar3 = (Frame *)operator_new(0xb8);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"main","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"([Ljava/lang/String;)V","");
  std::vector<Value,_std::allocator<Value>_>::vector(&local_c8,&local_148);
  Frame::Frame(pFVar3,classRuntime,&local_110,&local_50,&local_c8);
  VMStack::addFrame(this_00,pFVar3);
  if (local_c8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_90 + 0x20),"<clinit>","");
  this_02 = (ExecutionEngine *)local_90;
  local_90._0_8_ = local_90 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)this_02,"()V","");
  bVar1 = doesMethodExist(this_02,classRuntime,(string *)(local_90 + 0x20),(string *)local_90);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (bVar1) {
    pFVar3 = (Frame *)operator_new(0xb8);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"<clinit>","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"()V","");
    std::vector<Value,_std::allocator<Value>_>::vector(&local_e0,&local_148);
    Frame::Frame(pFVar3,classRuntime,&local_130,&local_b0,&local_e0);
    VMStack::addFrame(this_00,pFVar3);
    if (local_e0.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_e0.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  while (uVar2 = VMStack::size(this_00), uVar2 != 0) {
    pFVar3 = VMStack::getTopFrame(this_00);
    pbVar4 = Frame::getCode(pFVar3,pFVar3->pc);
    pcVar5 = (code *)this->_instructionFunctions[(ulong)*pbVar4 * 2];
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *(long *)((long)this->_instructionFunctions +
                                            (this->_instructionFunctions[(ulong)*pbVar4 * 2 + 1] - 8
                                            )) + -1);
    }
    (*pcVar5)();
  }
  if (local_148.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ExecutionEngine::startExecutionEngine(ClassRuntime *classRuntime) {
    VMStack &stackFrame = VMStack::getInstance();

    vector<Value> arguments;
    Value commandLineArgs;
    commandLineArgs.type = ValueType::REFERENCE;
    commandLineArgs.data.object = new ArrayObject(ValueType::REFERENCE);
    arguments.push_back(commandLineArgs);

    stackFrame.addFrame(new Frame(classRuntime, "main", "([Ljava/lang/String;)V", arguments));

    if (doesMethodExist(classRuntime, "<clinit>", "()V")) {
        stackFrame.addFrame(new Frame(classRuntime, "<clinit>", "()V", arguments));
    }

    while (stackFrame.size() > 0) {
        Frame *topFrame = stackFrame.getTopFrame();
        u1 *code = topFrame->getCode(topFrame->pc);
        (*this.*_instructionFunctions[code[0]])();
    }
}